

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easing.cpp
# Opt level: O0

qreal easeOutInExpo(qreal t)

{
  double in_XMM0_Qa;
  qreal qVar1;
  undefined8 local_8;
  
  if (0.5 <= in_XMM0_Qa) {
    qVar1 = easeInExpo(in_XMM0_Qa);
    local_8 = qVar1 / 2.0 + 0.5;
  }
  else {
    qVar1 = easeOutExpo(in_XMM0_Qa);
    local_8 = qVar1 / 2.0;
  }
  return local_8;
}

Assistant:

static qreal easeOutInExpo(qreal t)
{
    if (t < 0.5) return easeOutExpo (2*t)/2;
    return easeInExpo(2*t - 1)/2 + 0.5;
}